

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_Tree_clear(HTS_Tree *tree)

{
  _HTS_Pattern *p_Var1;
  HTS_Pattern *ptr;
  
  ptr = tree->head;
  while (ptr != (HTS_Pattern *)0x0) {
    p_Var1 = ptr->next;
    HTS_free(ptr->string);
    HTS_free(ptr);
    ptr = p_Var1;
  }
  if (tree->root != (HTS_Node *)0x0) {
    HTS_Node_clear(tree->root);
    HTS_free(tree->root);
  }
  tree->root = (HTS_Node *)0x0;
  tree->state = 0;
  tree->head = (HTS_Pattern *)0x0;
  tree->next = (_HTS_Tree *)0x0;
  return;
}

Assistant:

static void HTS_Tree_clear(HTS_Tree * tree)
{
   HTS_Pattern *pattern, *next_pattern;

   for (pattern = tree->head; pattern; pattern = next_pattern) {
      next_pattern = pattern->next;
      HTS_free(pattern->string);
      HTS_free(pattern);
   }
   if (tree->root != NULL) {
      HTS_Node_clear(tree->root);
      HTS_free(tree->root);
   }
   HTS_Tree_initialize(tree);
}